

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# our_gl.cpp
# Opt level: O3

mat4 * lookat(vec3f eye,vec3f center,vec3f up)

{
  vec<3UL,_double> *pvVar1;
  double *pdVar2;
  long lVar3;
  long lVar4;
  mat4 *in_RDI;
  long lVar5;
  bool bVar6;
  double dVar7;
  vec3f x;
  vec3f z;
  double in_stack_00000038;
  double in_stack_00000040;
  double in_stack_00000048;
  vec3f y;
  vec<3UL,_double> local_d8;
  double local_b8 [4];
  double local_98;
  double dStack_90;
  double local_88;
  double dStack_80;
  double local_78;
  undefined8 uStack_70;
  vec<3UL,_double> local_68;
  vec<3UL,_double> local_48;
  
  lVar5 = 3;
  do {
    dVar7 = vec<3UL,_double>::operator[](&z,lVar5 - 1);
    lVar3 = (ulong)(lVar5 != 2) * 8 + 8;
    if (lVar5 == 1) {
      lVar3 = 0;
    }
    *(double *)((long)&local_d8.x + lVar3) = *(double *)((long)&local_d8.x + lVar3) - dVar7;
    lVar5 = lVar5 + -1;
  } while (lVar5 != 0);
  pvVar1 = vec<3UL,_double>::normalize(&local_d8);
  local_b8[2] = pvVar1->z;
  local_b8[0] = pvVar1->x;
  local_b8[1] = pvVar1->y;
  uStack_70 = 0;
  local_68.x = in_stack_00000040 * local_b8[2] - in_stack_00000048 * local_b8[1];
  local_68.y = in_stack_00000048 * local_b8[0] - in_stack_00000038 * local_b8[2];
  local_68.z = in_stack_00000038 * local_b8[1] - local_b8[0] * in_stack_00000040;
  local_98 = local_b8[2];
  dStack_90 = local_b8[0];
  local_88 = local_b8[1];
  dStack_80 = local_b8[2];
  local_78 = local_b8[0];
  pvVar1 = vec<3UL,_double>::normalize(&local_68);
  local_d8.z = pvVar1->z;
  local_d8.x = pvVar1->x;
  local_d8.y = pvVar1->y;
  local_48.x = local_d8.z * local_88 - local_98 * local_d8.y;
  local_48.y = local_d8.x * dStack_80 - dStack_90 * local_d8.z;
  local_48.z = local_78 * local_d8.y - local_d8.x * local_88;
  pvVar1 = vec<3UL,_double>::normalize(&local_48);
  local_68.x = pvVar1->x;
  local_68.y = pvVar1->y;
  local_68.z = pvVar1->z;
  in_RDI->rows[3].data[2] = 0.0;
  in_RDI->rows[3].data[3] = 0.0;
  in_RDI->rows[3].data[0] = 0.0;
  in_RDI->rows[3].data[1] = 0.0;
  in_RDI->rows[2].data[2] = 0.0;
  in_RDI->rows[2].data[3] = 0.0;
  in_RDI->rows[2].data[0] = 0.0;
  in_RDI->rows[2].data[1] = 0.0;
  in_RDI->rows[1].data[2] = 0.0;
  in_RDI->rows[1].data[3] = 0.0;
  in_RDI->rows[1].data[0] = 0.0;
  in_RDI->rows[1].data[1] = 0.0;
  in_RDI->rows[0].data[2] = 0.0;
  in_RDI->rows[0].data[3] = 0.0;
  in_RDI->rows[0].data[0] = 0.0;
  in_RDI->rows[0].data[1] = 0.0;
  pdVar2 = in_RDI->rows[3].data + 3;
  lVar5 = 3;
  lVar3 = 0;
  do {
    lVar4 = 0;
    do {
      dVar7 = 1.0;
      if (lVar3 != lVar4) {
        dVar7 = 0.0;
      }
      pdVar2[lVar4] = dVar7;
      lVar4 = lVar4 + -1;
    } while (lVar4 != -4);
    lVar3 = lVar3 + -1;
    pdVar2 = pdVar2 + -4;
    bVar6 = lVar5 != 0;
    lVar5 = lVar5 + -1;
  } while (bVar6);
  lVar5 = 0;
  do {
    lVar3 = (ulong)(lVar5 != 8) * 8 + 8;
    if (lVar5 == 0) {
      lVar3 = 0;
    }
    *(undefined8 *)((long)in_RDI->rows[0].data + lVar5) = *(undefined8 *)((long)&local_d8.x + lVar3)
    ;
    *(undefined8 *)((long)in_RDI->rows[1].data + lVar5) = *(undefined8 *)((long)&local_68.x + lVar3)
    ;
    *(undefined8 *)((long)in_RDI->rows[2].data + lVar5) = *(undefined8 *)((long)local_b8 + lVar3);
    *(ulong *)((long)in_RDI->rows[0].data + lVar5 * 4 + 0x18) =
         *(ulong *)((long)&z.x + lVar3) ^ 0x8000000000000000;
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x18);
  return in_RDI;
}

Assistant:

mat4 lookat(vec3f eye, vec3f center, vec3f up)
{
    vec3f z = (eye - center).normalize();
    vec3f x = cross(up, z).normalize();
    vec3f y = cross(z, x).normalize();
    mat4 ModelView = mat4::identity();
    for (int i = 0; i < 3; i++) {
        ModelView[0][i] = x[i];
        ModelView[1][i] = y[i];
        ModelView[2][i] = z[i];
        ModelView[i][3] = -center[i];
    }
    return ModelView;
}